

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

string * __thiscall
Catch::getFormattedDuration_abi_cxx11_(string *__return_storage_ptr__,Catch *this,double duration)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  char buffer [314];
  char local_168 [328];
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  sprintf(local_168,"%.3f",duration);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(local_168);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_168,local_168 + sVar3);
  *piVar2 = iVar1;
  return __return_storage_ptr__;
}

Assistant:

std::string getFormattedDuration( double duration ) {
        // Max exponent + 1 is required to represent the whole part
        // + 1 for decimal point
        // + 3 for the 3 decimal places
        // + 1 for null terminator
        const std::size_t maxDoubleSize = DBL_MAX_10_EXP + 1 + 1 + 3 + 1;
        char buffer[maxDoubleSize];

        // Save previous errno, to prevent sprintf from overwriting it
        ErrnoGuard guard;
#ifdef _MSC_VER
        sprintf_s(buffer, "%.3f", duration);
#else
        std::sprintf(buffer, "%.3f", duration);
#endif
        return std::string(buffer);
    }